

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_check_magic.c
# Opt level: O2

void errmsg(char *m)

{
  size_t sVar1;
  size_t __n;
  ssize_t sVar2;
  
  sVar1 = strlen(m);
  while( true ) {
    if (sVar1 == 0) {
      return;
    }
    __n = strlen(m);
    sVar2 = write(2,m,__n);
    if (sVar2 < 1) break;
    m = m + sVar2;
    sVar1 = sVar1 - sVar2;
  }
  return;
}

Assistant:

static void
errmsg(const char *m)
{
	size_t s = strlen(m);
	ssize_t written;

	while (s > 0) {
		written = write(2, m, strlen(m));
		if (written <= 0)
			return;
		m += written;
		s -= written;
	}
}